

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_TimedText.cpp
# Opt level: O1

h__Writer * __thiscall
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource
          (h__Writer *this,FrameBuffer *FrameBuf,AESEncContext *Ctx,HMACContext *HMAC)

{
  int iVar1;
  _List_node_base *p_Var2;
  byte_t *pbVar3;
  ILogSink *this_00;
  int64_t tmp_pos;
  UL TmpUL;
  Partition GSPart;
  _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
  local_68 [56];
  
  if (*(int *)(FrameBuf + 10) == 3) {
    (**(code **)(*(long *)&FrameBuf->field_0x10 + 0x30))
              ((Result_t *)&GSPart,&FrameBuf->field_0x10,&tmp_pos);
    Kumu::Result_t::~Result_t((Result_t *)&GSPart);
    if (*(long *)&FrameBuf->field_0x8 == 0) {
      __assert_fail("m_Dict",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
                    ,0x25e,
                    "ASDCP::Result_t AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer &, ASDCP::AESEncContext *, ASDCP::HMACContext *)"
                   );
    }
    if (WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
        ::GenericStream_DataElement == '\0') {
      iVar1 = __cxa_guard_acquire(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                                   ::GenericStream_DataElement);
      if (iVar1 != 0) {
        pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)&FrameBuf->field_0x8);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_HasValue = true;
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._0_4_ =
             *(undefined4 *)pbVar3;
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._4_4_ =
             *(undefined4 *)(pbVar3 + 4);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._8_4_ =
             *(undefined4 *)(pbVar3 + 8);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.m_Value._12_4_ =
             *(undefined4 *)(pbVar3 + 0xc);
        WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.super_IArchive.
        _vptr_IArchive = (_func_int **)&PTR__IArchive_0016cc90;
        __cxa_guard_release(&WriteAncillaryResource(ASDCP::TimedText::FrameBuffer_const&,ASDCP::AESEncContext*,ASDCP::HMACContext*)
                             ::GenericStream_DataElement);
      }
    }
    ASDCP::MXF::Partition::Partition(&GSPart,*(Dictionary **)&FrameBuf->field_0x8);
    iVar1 = *(int *)&FrameBuf[0x12].m_MIMEType._M_dataplus._M_p;
    *(int *)&FrameBuf[0x12].m_MIMEType._M_dataplus._M_p = iVar1 + 1;
    p_Var2 = (_List_node_base *)operator_new(0x28);
    p_Var2[1]._M_next = (_List_node_base *)&PTR__IArchive_0016ce10;
    *(int *)&p_Var2[1]._M_prev = iVar1;
    p_Var2[2]._M_next = (_List_node_base *)tmp_pos;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    FrameBuf[8].m_MIMEType._M_dataplus._M_p = FrameBuf[8].m_MIMEType._M_dataplus._M_p + 1;
    std::
    _Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
    ::operator=(local_68,(_Rb_tree<ASDCP::UL,_ASDCP::UL,_std::_Identity<ASDCP::UL>,_std::less<ASDCP::UL>,_std::allocator<ASDCP::UL>_>
                          *)&FrameBuf[3].m_MIMEType);
    pbVar3 = (byte_t *)ASDCP::Dictionary::Type((MDD_t)*(undefined8 *)&FrameBuf->field_0x8);
    TmpUL.super_Identifier<16U>.m_HasValue = true;
    TmpUL.super_Identifier<16U>.m_Value._0_8_ = *(undefined8 *)pbVar3;
    TmpUL.super_Identifier<16U>.m_Value._8_8_ = *(undefined8 *)(pbVar3 + 8);
    TmpUL.super_Identifier<16U>.super_IArchive._vptr_IArchive =
         (_func_int **)&PTR__IArchive_0016cc90;
    ASDCP::MXF::Partition::WriteToFile((FileWriter *)this,(UL *)&GSPart);
    if (-1 < *(int *)&(this->super_h__AS02WriterClip<AS_02::MXF::AS02IndexWriterCBR>).
                      super_h__AS02Writer<AS_02::MXF::AS02IndexWriterCBR>.
                      super_TrackFileWriter<ASDCP::MXF::OP1aHeader>._vptr_TrackFileWriter) {
      ASDCP::Write_EKLV_Packet
                ((FileWriter *)&tmp_pos,(Dictionary *)&FrameBuf->field_0x10,
                 *(OP1aHeader **)&FrameBuf->field_0x8,
                 (WriterInfo *)((long)&(FrameBuf->m_MIMEType).field_2 + 8),
                 (FrameBuffer *)&FrameBuf[10].field_0x8,(uint *)(FrameBuf[9].m_AssetID + 8),
                 (ulonglong *)&FrameBuf[9].field_0x20,(FrameBuffer *)FrameBuf[9].m_AssetID,
                 (uchar *)Ctx,
                 (uint *)WriteAncillaryResource::GenericStream_DataElement.super_Identifier<16U>.
                         m_Value,(AESEncContext *)&ASDCP::MXF_BER_LENGTH,HMAC);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&tmp_pos);
      Kumu::Result_t::~Result_t((Result_t *)&tmp_pos);
    }
    *(int *)&FrameBuf[9].field_0x20 = *(int *)&FrameBuf[9].field_0x20 + 1;
    ASDCP::MXF::Partition::~Partition(&GSPart);
  }
  else {
    this_00 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error
              (this_00,"RESULT_STATE RETURNED at %s (%d)\n",
               "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/AS_02_TimedText.cpp"
               ,0x259);
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_STATE);
  }
  return this;
}

Assistant:

ASDCP::Result_t
AS_02::TimedText::MXFWriter::h__Writer::WriteAncillaryResource(const ASDCP::TimedText::FrameBuffer& FrameBuf,
							       ASDCP::AESEncContext* Ctx, ASDCP::HMACContext* HMAC)
{
  if ( ! m_State.Test_RUNNING() )
    {
      KM_RESULT_STATE_HERE();
      return RESULT_STATE;
    }

  Kumu::fpos_t here = m_File.TellPosition();
  assert(m_Dict);

  // create generic stream partition header
  static UL GenericStream_DataElement(m_Dict->ul(MDD_GenericStream_DataElement));
  ASDCP::MXF::Partition GSPart(m_Dict);

  GSPart.MajorVersion = m_HeaderPart.MajorVersion;
  GSPart.MinorVersion = m_HeaderPart.MinorVersion;
  GSPart.ThisPartition = here;
  GSPart.PreviousPartition = m_RIP.PairArray.back().ByteOffset;
  GSPart.BodySID = m_EssenceStreamID;
  GSPart.OperationalPattern = m_HeaderPart.OperationalPattern;

  m_RIP.PairArray.push_back(RIP::PartitionPair(m_EssenceStreamID++, here));
  GSPart.EssenceContainers = m_HeaderPart.EssenceContainers;
  UL TmpUL(m_Dict->ul(MDD_GenericStreamPartition));
  Result_t result = GSPart.WriteToFile(m_File, TmpUL);

  if ( KM_SUCCESS(result) )
    {
      result = Write_EKLV_Packet(m_File, *m_Dict, m_HeaderPart, m_Info, m_CtFrameBuf, m_FramesWritten,
				 m_StreamOffset, FrameBuf, GenericStream_DataElement.Value(),
				 MXF_BER_LENGTH, Ctx, HMAC);
    }

  m_FramesWritten++;
  return result;
}